

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  lu_int32 *plVar1;
  byte bVar2;
  global_State *pgVar3;
  GCObject *L_00;
  GCObject *pGVar4;
  bool bVar5;
  Node *pNStack_40;
  
  pgVar3 = L->l_G;
  bVar2 = pgVar3->currentwhite;
switchD_0010812a_default:
  while( true ) {
    L_00 = ((lua_State *)p)->next;
    if ((L_00 == (GCObject *)0x0) || (bVar5 = count == 0, count = count - 1, bVar5)) {
      return &((lua_State *)p)->next;
    }
    if ((L_00->gch).tt == '\b') {
      sweeplist(L,&(L_00->th).openupval,0xfffffffffffffffd);
    }
    if ((byte)(((L_00->gch).marked ^ 3) & (bVar2 ^ 3)) == 0) break;
    (L_00->gch).marked = pgVar3->currentwhite & 3 | (L_00->gch).marked & 0xf8;
    p = (GCObject **)L_00;
  }
  pGVar4 = (L_00->gch).next;
  ((lua_State *)p)->next = pGVar4;
  if (L_00 == pgVar3->rootgc) {
    pgVar3->rootgc = pGVar4;
  }
  switch((L_00->gch).tt) {
  case '\x04':
    plVar1 = &(L->l_G->strt).nuse;
    *plVar1 = *plVar1 - 1;
    pNStack_40 = (Node *)((long)&((L_00->h).metatable)->array + 1);
    break;
  case '\x05':
    if ((L_00->h).node != &dummynode_) {
      luaM_realloc_(L,(L_00->h).node,0x28L << ((L_00->h).lsizenode & 0x3f),0);
    }
    luaM_realloc_(L,(L_00->h).array,(long)(L_00->h).sizearray << 4,0);
    pNStack_40 = (Node *)0x40;
    break;
  case '\x06':
    pNStack_40 = (Node *)(ulong)(((uint)(L_00->h).lsizenode <<
                                 (4U - ((L_00->h).flags == '\0') & 0x1f)) + 0x28 & 0xfff8);
    break;
  case '\a':
    pNStack_40 = (L_00->h).node + 1;
    break;
  case '\b':
    luaF_close(&L_00->th,(L_00->th).stack);
    freestack(L,&L_00->th);
    pNStack_40 = (Node *)0xb8;
    break;
  case '\t':
    luaM_realloc_(L,(L_00->h).array,(long)(L_00->p).sizecode << 2,0);
    luaM_realloc_(L,(L_00->h).node,(long)(L_00->p).sizep << 3,0);
    luaM_realloc_(L,(L_00->h).metatable,(long)(L_00->p).sizek << 4,0);
    luaM_realloc_(L,(L_00->h).lastfree,(long)(L_00->p).sizelineinfo << 2,0);
    luaM_realloc_(L,(L_00->h).gclist,(long)(L_00->p).sizelocvars << 4,0);
    luaM_realloc_(L,(L_00->p).upvalues,(long)(L_00->p).sizeupvalues << 3,0);
    pNStack_40 = (Node *)0x78;
    break;
  case '\n':
    luaF_freeupval(L,&L_00->uv);
  default:
    goto switchD_0010812a_default;
  }
  luaM_realloc_(L,L_00,(size_t)pNStack_40,0);
  goto switchD_0010812a_default;
}

Assistant:

static GCObject**sweeplist(lua_State*L,GCObject**p,lu_mem count){
GCObject*curr;
global_State*g=G(L);
int deadmask=otherwhite(g);
while((curr=*p)!=NULL&&count-->0){
if(curr->gch.tt==8)
sweepwholelist(L,&gco2th(curr)->openupval);
if((curr->gch.marked^bit2mask(0,1))&deadmask){
makewhite(g,curr);
p=&curr->gch.next;
}
else{
*p=curr->gch.next;
if(curr==g->rootgc)
g->rootgc=curr->gch.next;
freeobj(L,curr);
}
}
return p;
}